

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.c
# Opt level: O2

void uv_pipe_connect(uv_connect_t *req,uv_pipe_t *handle,char *name,uv_connect_cb cb)

{
  int iVar1;
  long *plVar2;
  int iVar3;
  int *piVar4;
  sockaddr local_9e [6];
  undefined1 local_31;
  
  iVar1 = (handle->io_watcher).fd;
  if (iVar1 == -1) {
    iVar3 = uv__socket(1,1,0);
    if (iVar3 < 0) goto LAB_004f5293;
    (handle->io_watcher).fd = iVar3;
  }
  strncpy(local_9e[0].sa_data,name,0x6b);
  local_31 = 0;
  local_9e[0].sa_family = 1;
  do {
    iVar3 = connect((handle->io_watcher).fd,local_9e,0x6e);
    if (iVar3 != -1) goto LAB_004f5253;
    piVar4 = __errno_location();
    iVar3 = *piVar4;
  } while (iVar3 == 4);
  if (iVar3 == 0x73) {
LAB_004f5253:
    if (iVar1 == -1) {
      iVar3 = uv__stream_open((uv_stream_t *)handle,(handle->io_watcher).fd,0x60);
      if (iVar3 != 0) goto LAB_004f5293;
    }
    uv__io_start(handle->loop,&handle->io_watcher,5);
    iVar3 = 0;
  }
  else {
    iVar3 = -iVar3;
  }
LAB_004f5293:
  handle->delayed_error = iVar3;
  handle->connect_req = req;
  req->type = UV_CONNECT;
  req->active_queue[0] = handle->loop->active_reqs;
  plVar2 = (long *)handle->loop->active_reqs[1];
  req->active_queue[1] = plVar2;
  *plVar2 = (long)req->active_queue;
  handle->loop->active_reqs[1] = req->active_queue;
  req->handle = (uv_stream_t *)handle;
  req->cb = cb;
  req->queue[0] = req->queue;
  req->queue[1] = req->queue;
  if (iVar3 != 0) {
    uv__io_feed(handle->loop,&handle->io_watcher);
  }
  return;
}

Assistant:

void uv_pipe_connect(uv_connect_t* req,
                    uv_pipe_t* handle,
                    const char* name,
                    uv_connect_cb cb) {
  struct sockaddr_un saddr;
  int new_sock;
  int err;
  int r;

  new_sock = (uv__stream_fd(handle) == -1);

  if (new_sock) {
    err = uv__socket(AF_UNIX, SOCK_STREAM, 0);
    if (err < 0)
      goto out;
    handle->io_watcher.fd = err;
  }

  memset(&saddr, 0, sizeof saddr);
  strncpy(saddr.sun_path, name, sizeof(saddr.sun_path) - 1);
  saddr.sun_path[sizeof(saddr.sun_path) - 1] = '\0';
  saddr.sun_family = AF_UNIX;

  do {
    r = connect(uv__stream_fd(handle),
                (struct sockaddr*)&saddr, sizeof saddr);
  }
  while (r == -1 && errno == EINTR);

  if (r == -1 && errno != EINPROGRESS) {
    err = -errno;
#if defined(__CYGWIN__) || defined(__MSYS__)
    /* EBADF is supposed to mean that the socket fd is bad, but
       Cygwin reports EBADF instead of ENOTSOCK when the file is
       not a socket.  We do not expect to see a bad fd here
       (e.g. due to new_sock), so translate the error.  */
    if (err == -EBADF)
      err = -ENOTSOCK;
#endif
    goto out;
  }

  err = 0;
  if (new_sock) {
    err = uv__stream_open((uv_stream_t*)handle,
                          uv__stream_fd(handle),
                          UV_STREAM_READABLE | UV_STREAM_WRITABLE);
  }

  if (err == 0)
    uv__io_start(handle->loop, &handle->io_watcher, POLLIN | POLLOUT);

out:
  handle->delayed_error = err;
  handle->connect_req = req;

  uv__req_init(handle->loop, req, UV_CONNECT);
  req->handle = (uv_stream_t*)handle;
  req->cb = cb;
  QUEUE_INIT(&req->queue);

  /* Force callback to run on next tick in case of error. */
  if (err)
    uv__io_feed(handle->loop, &handle->io_watcher);

}